

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_interface_linux.c
# Opt level: O0

int os_interface_linux_address_set(os_interface_ip_change *addr)

{
  undefined4 uVar1;
  oonf_log_source source;
  list_entity *plVar2;
  byte bVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  void *data;
  undefined1 local_4fa [8];
  netaddr_str nbuf;
  int seq;
  ifaddrmsg *ifaddrreq;
  nlmsghdr *msg;
  uint8_t buffer [1024];
  os_interface_ip_change *addr_local;
  
  buffer._1016_8_ = addr;
  memset(&msg,0,0x400);
  source = _oonf_os_interface_subsystem.logging;
  if ((*(byte *)(buffer._1016_8_ + 0x34) & 1) == 0) {
    msg._6_2_ = 5;
    msg._4_2_ = 0x15;
  }
  else {
    msg._6_2_ = 0x505;
    msg._4_2_ = 0x14;
  }
  msg._0_4_ = 0x18;
  if ((log_global_mask[_oonf_os_interface_subsystem.logging] & 1) != 0) {
    pcVar5 = "re";
    if ((*(byte *)(buffer._1016_8_ + 0x34) & 1) != 0) {
      pcVar5 = "";
    }
    uVar1 = *(undefined4 *)(buffer._1016_8_ + 0x2c);
    pcVar6 = netaddr_to_prefixstring
                       ((netaddr_str *)local_4fa,(netaddr *)(buffer._1016_8_ + 0x18),false);
    oonf_log(LOG_SEVERITY_DEBUG,source,"src/base/os_linux/os_interface_linux.c",0x1d2,(void *)0x0,0,
             "%sset address on if %d: %s",pcVar5,uVar1,pcVar6);
  }
  register0x00000000 = buffer + 8;
  buffer[8] = *(uint8_t *)(buffer._1016_8_ + 0x28);
  buffer[9] = *(uint8_t *)(buffer._1016_8_ + 0x29);
  buffer._12_4_ = *(undefined4 *)(buffer._1016_8_ + 0x2c);
  buffer[0xb] = (uint8_t)*(undefined4 *)(buffer._1016_8_ + 0x30);
  data = (void *)(buffer._1016_8_ + 0x18);
  bVar3 = netaddr_get_af_maxprefix((uint)*(byte *)(buffer._1016_8_ + 0x28));
  iVar4 = os_system_linux_netlink_addreq(&_rtnetlink_receiver,(nlmsghdr *)&msg,2,data,bVar3 / 8);
  if (iVar4 == 0) {
    iVar4 = os_system_linux_netlink_send(&_rtnetlink_receiver,(nlmsghdr *)&msg);
    plVar2 = _rtnetlink_feedback.prev;
    if (*(long *)(buffer._1016_8_ + 0x38) != 0) {
      *(list_entity **)buffer._1016_8_ = &_rtnetlink_feedback;
      *(list_entity **)(buffer._1016_8_ + 8) = _rtnetlink_feedback.prev;
      _rtnetlink_feedback.prev = (list_entity *)buffer._1016_8_;
      plVar2->next = (list_entity *)buffer._1016_8_;
      *(int *)(buffer._1016_8_ + 0x10) = iVar4;
    }
    addr_local._4_4_ = 0;
  }
  else {
    addr_local._4_4_ = -1;
  }
  return addr_local._4_4_;
}

Assistant:

int
os_interface_linux_address_set(struct os_interface_ip_change *addr) {
  uint8_t buffer[UIO_MAXIOV];
  struct nlmsghdr *msg;
  struct ifaddrmsg *ifaddrreq;
  int seq;
#if defined(OONF_LOG_DEBUG_INFO)
  struct netaddr_str nbuf;
#endif

  memset(buffer, 0, sizeof(buffer));

  /* get pointers for netlink message */
  msg = (void *)&buffer[0];

  if (addr->set) {
    msg->nlmsg_flags = NLM_F_REQUEST | NLM_F_CREATE | NLM_F_REPLACE | NLM_F_ACK;
    msg->nlmsg_type = RTM_NEWADDR;
  }
  else {
    msg->nlmsg_flags = NLM_F_REQUEST | NLM_F_ACK;
    msg->nlmsg_type = RTM_DELADDR;
  }

  /* set length of netlink message with ifaddrmsg payload */
  msg->nlmsg_len = NLMSG_LENGTH(sizeof(struct ifaddrmsg));

  OONF_DEBUG(LOG_OS_INTERFACE, "%sset address on if %d: %s", addr->set ? "" : "re", addr->if_index,
    netaddr_to_string(&nbuf, &addr->address));

  ifaddrreq = NLMSG_DATA(msg);
  ifaddrreq->ifa_family = netaddr_get_address_family(&addr->address);
  ifaddrreq->ifa_prefixlen = netaddr_get_prefix_length(&addr->address);
  ifaddrreq->ifa_index = addr->if_index;
  ifaddrreq->ifa_scope = addr->scope;

  if (os_system_linux_netlink_addnetaddr(&_rtnetlink_receiver, msg, IFA_LOCAL, &addr->address)) {
    return -1;
  }

  /* cannot fail */
  seq = os_system_linux_netlink_send(&_rtnetlink_receiver, msg);

  if (addr->cb_finished) {
    list_add_tail(&_rtnetlink_feedback, &addr->_internal._node);
    addr->_internal.nl_seq = seq;
  }
  return 0;
}